

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

int __thiscall molly::Device::close(Device *this,int __fd)

{
  MollyError *pMVar1;
  int iVar2;
  undefined4 in_register_00000034;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (this->_fd == -1) {
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
    std::__cxx11::string::string((string *)&local_38,"Device not open",&local_59);
    MollyError::MollyError(pMVar1,&local_38);
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  iVar2 = ::close(this->_fd);
  if (iVar2 == 0) {
    return 0;
  }
  pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_58,"Error closing device",&local_59);
  MollyError::MollyError(pMVar1,&local_58);
  __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
}

Assistant:

void Device::close()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not open");

  int res = ::close(_fd);

  if (res != 0)
    throw MollyError("Error closing device");
}